

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

void SVGChart::FindRange(PlotDataBase *inData,float inMin,float inMax,long *outStartIndex,
                        long *outEndIndex)

{
  long lVar1;
  long lVar2;
  float fVar3;
  
  *outStartIndex = 0;
  lVar1 = PlotDataBase::GetSize(inData);
  if (0 < lVar1) {
    do {
      fVar3 = PlotDataBase::GetValue(inData,*outStartIndex);
      if (inMin < fVar3) break;
      lVar1 = *outStartIndex;
      *outStartIndex = lVar1 + 1;
      lVar2 = PlotDataBase::GetSize(inData);
    } while (lVar1 + 1 < lVar2);
  }
  lVar1 = *outStartIndex;
  lVar2 = PlotDataBase::GetSize(inData);
  if (lVar1 == lVar2) {
    lVar1 = PlotDataBase::GetSize(inData);
    *outStartIndex = lVar1 + -1;
    *outEndIndex = lVar1 + -1;
    if (*outStartIndex < 0) {
      __assert_fail("outStartIndex>-1",
                    "/workspace/llm4binary/github/license_c_cmakelists/davecom[P]SVGChart/PPlot.cpp"
                    ,0x59e,
                    "void SVGChart::FindRange(const PlotDataBase &, float, float, long &, long &)");
    }
  }
  else {
    if (0 < *outStartIndex) {
      *outStartIndex = *outStartIndex + -1;
    }
    lVar1 = *outStartIndex;
    while( true ) {
      *outEndIndex = lVar1;
      lVar2 = PlotDataBase::GetSize(inData);
      if (lVar2 <= lVar1) break;
      fVar3 = PlotDataBase::GetValue(inData,*outEndIndex);
      if (inMax <= fVar3) break;
      lVar1 = *outEndIndex + 1;
    }
    lVar1 = *outEndIndex;
    lVar2 = PlotDataBase::GetSize(inData);
    if (lVar1 == lVar2) {
      *outEndIndex = *outEndIndex + -1;
    }
    if (*outStartIndex < 0) {
      __assert_fail("outStartIndex>-1",
                    "/workspace/llm4binary/github/license_c_cmakelists/davecom[P]SVGChart/PPlot.cpp"
                    ,0x5af,
                    "void SVGChart::FindRange(const PlotDataBase &, float, float, long &, long &)");
    }
  }
  return;
}

Assistant:

void FindRange (const PlotDataBase &inData, float inMin, float inMax, long& outStartIndex, long& outEndIndex) {
        outStartIndex = 0;
        while (outStartIndex < inData.GetSize () && inData.GetValue (outStartIndex) <= inMin) {
            outStartIndex++;
        }

        if (outStartIndex == inData.GetSize ()) {
            outStartIndex = inData.GetSize () - 1;
            outEndIndex = outStartIndex;
            assert (outStartIndex>-1);
            return;
        }

        // We want the value at outStartIndex smaller than or equal to inMin
        if (outStartIndex > 0) {
            outStartIndex--;
        }

        outEndIndex = outStartIndex;
        while (outEndIndex < inData.GetSize () && inData.GetValue (outEndIndex) < inMax) {
            outEndIndex++;
        }

        if (outEndIndex == inData.GetSize ()) {
            outEndIndex--;
        }
        assert (outStartIndex>-1);
    }